

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset_util.c
# Opt level: O0

size_t bitset_extract_setbits_sse_uint16
                 (uint64_t *words,size_t length,uint16_t *out,size_t outcapacity,uint16_t base)

{
  byte bVar1;
  byte bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  byte bVar8;
  ushort uVar9;
  int iVar10;
  short *psVar11;
  long in_RCX;
  short *in_RDX;
  ulong in_RSI;
  long in_RDI;
  short in_R8W;
  int r;
  uint64_t w_1;
  uint8_t advanceB;
  uint8_t advanceA;
  __m128i vecB;
  __m128i vecA;
  uint8_t byteB;
  uint8_t byteA;
  int k;
  uint64_t w;
  size_t i;
  int numberofbytes;
  uint16_t *safeout;
  __m128i add8;
  __m128i incVec;
  __m128i baseVec;
  uint16_t *initout;
  unsigned_long_long local_228;
  undefined8 local_208;
  undefined8 uStack_200;
  int local_1ec;
  ulong local_1e8;
  ulong local_1e0;
  undefined1 local_1a8 [16];
  short local_182;
  short *local_178;
  
  uVar9 = in_R8W - 1;
  auVar6 = vpinsrw_avx(ZEXT216(uVar9),(uint)uVar9,1);
  auVar6 = vpinsrw_avx(auVar6,(uint)uVar9,2);
  auVar6 = vpinsrw_avx(auVar6,(uint)uVar9,3);
  auVar6 = vpinsrw_avx(auVar6,(uint)uVar9,4);
  auVar6 = vpinsrw_avx(auVar6,(uint)uVar9,5);
  auVar6 = vpinsrw_avx(auVar6,(uint)uVar9,6);
  local_1a8 = vpinsrw_avx(auVar6,(uint)uVar9,7);
  auVar6 = vpinsrw_avx(ZEXT216(0x40),0x40,1);
  auVar6 = vpinsrw_avx(auVar6,0x40,2);
  auVar6 = vpinsrw_avx(auVar6,0x40,3);
  auVar6 = vpinsrw_avx(auVar6,0x40,4);
  auVar6 = vpinsrw_avx(auVar6,0x40,5);
  auVar6 = vpinsrw_avx(auVar6,0x40,6);
  auVar6 = vpinsrw_avx(auVar6,0x40,7);
  auVar7 = vpinsrw_avx(ZEXT216(8),8,1);
  auVar7 = vpinsrw_avx(auVar7,8,2);
  auVar7 = vpinsrw_avx(auVar7,8,3);
  auVar7 = vpinsrw_avx(auVar7,8,4);
  auVar7 = vpinsrw_avx(auVar7,8,5);
  auVar7 = vpinsrw_avx(auVar7,8,6);
  auVar7 = vpinsrw_avx(auVar7,8,7);
  psVar11 = in_RDX + in_RCX;
  local_178 = in_RDX;
  for (local_1e0 = 0; local_1e0 < in_RSI && local_178 + 0x10 <= psVar11; local_1e0 = local_1e0 + 1)
  {
    local_1e8 = *(ulong *)(in_RDI + local_1e0 * 8);
    if (local_1e8 == 0) {
      local_1a8 = vpaddw_avx(local_1a8,auVar6);
    }
    else {
      for (local_1ec = 0; local_1ec < 4; local_1ec = local_1ec + 1) {
        bVar8 = (byte)(local_1e8 >> 8);
        bVar1 = lengthTable[local_1e8 & 0xff];
        bVar2 = lengthTable[bVar8];
        auVar3 = vpaddw_avx(local_1a8,(undefined1  [16])vecDecodeTable_uint16[local_1e8 & 0xff]);
        auVar4 = vpaddw_avx(local_1a8,auVar7);
        auVar5 = vpaddw_avx(auVar4,(undefined1  [16])vecDecodeTable_uint16[bVar8]);
        local_1a8 = vpaddw_avx(auVar4,auVar7);
        local_208 = auVar3._0_8_;
        uStack_200 = auVar3._8_8_;
        *(undefined8 *)local_178 = local_208;
        *(undefined8 *)(local_178 + 4) = uStack_200;
        *(undefined1 (*) [16])(local_178 + (int)(uint)bVar1) = auVar5;
        local_178 = (short *)(*(undefined1 (*) [16])(local_178 + (int)(uint)bVar1) +
                             (long)(int)(uint)bVar2 * 2);
        local_1e8 = local_1e8 >> 0x10;
      }
    }
  }
  local_182 = in_R8W + (short)((local_1e0 & 0x3ff) << 6);
  for (; local_1e0 < in_RSI && local_178 < psVar11; local_1e0 = local_1e0 + 1) {
    for (local_228 = *(unsigned_long_long *)(in_RDI + local_1e0 * 8);
        local_228 != 0 && local_178 < psVar11; local_228 = local_228 - 1 & local_228) {
      iVar10 = roaring_trailing_zeroes(local_228);
      *local_178 = (short)iVar10 + local_182;
      local_178 = local_178 + 1;
    }
    local_182 = local_182 + 0x40;
  }
  return (long)local_178 - (long)in_RDX >> 1;
}

Assistant:

CROARING_TARGET_AVX2
size_t bitset_extract_setbits_sse_uint16(const uint64_t *words, size_t length,
                                         uint16_t *out, size_t outcapacity,
                                         uint16_t base) {
    uint16_t *initout = out;
    __m128i baseVec = _mm_set1_epi16(base - 1);
    __m128i incVec = _mm_set1_epi16(64);
    __m128i add8 = _mm_set1_epi16(8);
    uint16_t *safeout = out + outcapacity;
    const int numberofbytes = 2;  // process two bytes at a time
    size_t i = 0;
    for (; (i < length) && (out + numberofbytes * 8 <= safeout); ++i) {
        uint64_t w = words[i];
        if (w == 0) {
            baseVec = _mm_add_epi16(baseVec, incVec);
        } else {
            for (int k = 0; k < 4; ++k) {
                uint8_t byteA = (uint8_t)w;
                uint8_t byteB = (uint8_t)(w >> 8);
                w >>= 16;
                __m128i vecA = _mm_loadu_si128(
                    (const __m128i *)vecDecodeTable_uint16[byteA]);
                __m128i vecB = _mm_loadu_si128(
                    (const __m128i *)vecDecodeTable_uint16[byteB]);
                uint8_t advanceA = lengthTable[byteA];
                uint8_t advanceB = lengthTable[byteB];
                vecA = _mm_add_epi16(baseVec, vecA);
                baseVec = _mm_add_epi16(baseVec, add8);
                vecB = _mm_add_epi16(baseVec, vecB);
                baseVec = _mm_add_epi16(baseVec, add8);
                _mm_storeu_si128((__m128i *)out, vecA);
                out += advanceA;
                _mm_storeu_si128((__m128i *)out, vecB);
                out += advanceB;
            }
        }
    }
    base += (uint16_t)(i * 64);
    for (; (i < length) && (out < safeout); ++i) {
        uint64_t w = words[i];
        while ((w != 0) && (out < safeout)) {
            int r = roaring_trailing_zeroes(w);
            *out = (uint16_t)(r + base);
            out++;
            w &= (w - 1);
        }
        base += 64;
    }
    return out - initout;
}